

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<wchar_t,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<1>>
::operator()(padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<wchar_t,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<1>>
             *this,wchar_t **it)

{
  wchar_t wVar1;
  long lVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  wchar_t *pwVar7;
  wchar_t *pwVar8;
  ulong uVar9;
  char *pcVar10;
  uint uVar11;
  long lVar12;
  int iVar14;
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  int iVar17;
  undefined1 auVar16 [16];
  
  pwVar7 = *it;
  if (0 < *(long *)(this + 0x10)) {
    pcVar10 = *(char **)(this + 8);
    uVar9 = *(long *)(this + 0x10) + 1;
    do {
      *pwVar7 = (int)*pcVar10;
      pcVar10 = pcVar10 + 1;
      pwVar7 = pwVar7 + 1;
      uVar9 = uVar9 - 1;
    } while (1 < uVar9);
  }
  auVar6 = _DAT_0015e260;
  auVar5 = _DAT_0015e250;
  auVar4 = _DAT_0015e240;
  lVar2 = *(long *)(this + 0x20);
  pwVar8 = pwVar7;
  if (lVar2 != 0) {
    pwVar8 = pwVar7 + lVar2;
    wVar1 = *(wchar_t *)(this + 0x18);
    uVar9 = lVar2 + 0x3fffffffffffffffU & 0x3fffffffffffffff;
    auVar13._8_4_ = (int)uVar9;
    auVar13._0_8_ = uVar9;
    auVar13._12_4_ = (int)(uVar9 >> 0x20);
    lVar12 = 0;
    auVar13 = auVar13 ^ _DAT_0015e260;
    do {
      auVar15._8_4_ = (int)lVar12;
      auVar15._0_8_ = lVar12;
      auVar15._12_4_ = (int)((ulong)lVar12 >> 0x20);
      auVar16 = (auVar15 | auVar5) ^ auVar6;
      iVar14 = auVar13._4_4_;
      if ((bool)(~(auVar16._4_4_ == iVar14 && auVar13._0_4_ < auVar16._0_4_ ||
                  iVar14 < auVar16._4_4_) & 1)) {
        pwVar7[lVar12] = wVar1;
      }
      if ((auVar16._12_4_ != auVar13._12_4_ || auVar16._8_4_ <= auVar13._8_4_) &&
          auVar16._12_4_ <= auVar13._12_4_) {
        pwVar7[lVar12 + 1] = wVar1;
      }
      auVar15 = (auVar15 | auVar4) ^ auVar6;
      iVar17 = auVar15._4_4_;
      if (iVar17 <= iVar14 && (iVar17 != iVar14 || auVar15._0_4_ <= auVar13._0_4_)) {
        pwVar7[lVar12 + 2] = wVar1;
        pwVar7[lVar12 + 3] = wVar1;
      }
      lVar12 = lVar12 + 4;
    } while ((uVar9 - ((uint)(lVar2 + 0x3fffffffffffffffU) & 3)) + 4 != lVar12);
  }
  iVar14 = *(int *)(this + 0x2c);
  pwVar7 = pwVar8 + iVar14;
  uVar11 = *(uint *)(this + 0x28);
  do {
    pwVar7 = pwVar7 + -1;
    *pwVar7 = uVar11 & 1 | 0x30;
    bVar3 = 1 < uVar11;
    uVar11 = uVar11 >> 1;
  } while (bVar3);
  *it = pwVar8 + iVar14;
  return;
}

Assistant:

FMT_CONSTEXPR iterator begin() const { return data_; }